

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

size_t cmdSigEnc(octet *buf,cmd_sig_t *sig)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  der_anchor_t *pdVar5;
  long in_RSI;
  long in_RDI;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  size_t count;
  der_anchor_t Signature [1];
  size_t in_stack_ffffffffffffff68;
  octet *in_stack_ffffffffffffff70;
  der_anchor_t *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  u32 tag;
  octet *in_stack_ffffffffffffff88;
  der_anchor_t *anchor;
  size_t pos;
  octet *in_stack_ffffffffffffff98;
  long local_40;
  
  tag = (u32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  sVar2 = derTSEQEncStart(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,0);
  if (in_RDI == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = in_RDI + sVar2;
  }
  pos = sVar3;
  sVar4 = derEnc(in_stack_ffffffffffffff88,tag,in_stack_ffffffffffffff78,
                 (size_t)in_stack_ffffffffffffff70);
  if (sVar3 == 0) {
    pdVar5 = (der_anchor_t *)0x0;
  }
  else {
    pdVar5 = (der_anchor_t *)(sVar3 + sVar4);
  }
  local_40 = sVar4 + sVar2;
  anchor = pdVar5;
  bVar1 = memIsZero((void *)(in_RSI + 0x628),6);
  if (bVar1 == 0) {
    sVar2 = derEnc((octet *)anchor,tag,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    if (pdVar5 == (der_anchor_t *)0x0) {
      tag = 0;
    }
    else {
      tag = (u32)((ulong)((long)&pdVar5->der + sVar2) >> 0x20);
    }
    local_40 = sVar2 + local_40;
  }
  sVar2 = derEnc((octet *)anchor,tag,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
  sVar3 = derTSEQEncStop(in_stack_ffffffffffffff98,pos,anchor);
  return sVar3 + sVar2 + local_40;
}

Assistant:

static size_t cmdSigEnc(octet buf[], const cmd_sig_t* sig)
{
	der_anchor_t Signature[1];
	size_t count = 0;
	// pre
	ASSERT(cmdSigSeemsValid(sig));
	// начать кодирование...
	derEncStep(derSEQEncStart(Signature, buf, count), buf, count);
	// ...сертификаты...
	derEncStep(derEnc(buf, 0x30, sig->certs, sig->certs_len), buf, count);
	// ...дата...
	if (!memIsZero(sig->date, 6))
		derEncStep(derOCTEnc(buf, sig->date, 6), buf, count);
	// ...подпись...
	derEncStep(derOCTEnc(buf, sig->sig, sig->sig_len), buf, count);
	// ...завершить кодирование
	derEncStep(derSEQEncStop(buf, count, Signature), buf, count);
	// возвратить длину DER-кода
	return count;
}